

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.hpp
# Opt level: O0

void ellipses::display_ellipses<cv::RotatedRect*>
               (Mat *image_test,RotatedRect *ellipses_begin,RotatedRect *ellipses_end)

{
  _InputArray local_130;
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [32];
  Scalar_<double> local_c8;
  _InputOutputArray local_98;
  Mat local_80 [8];
  Mat tmp;
  RotatedRect *ellipses_end_local;
  RotatedRect *ellipses_begin_local;
  Mat *image_test_local;
  
  cv::Mat::clone();
  for (ellipses_end_local = ellipses_begin; ellipses_end_local != ellipses_end;
      ellipses_end_local = ellipses_end_local + 1) {
    cv::_InputOutputArray::_InputOutputArray(&local_98,local_80);
    cv::Scalar_<double>::Scalar_(&local_c8,0.0,255.0,0.0,0.0);
    cv::ellipse(&local_98,ellipses_end_local,(Scalar_ *)&local_c8,3,8);
    cv::_InputOutputArray::~_InputOutputArray(&local_98);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"Output",&local_e9);
  cv::namedWindow(local_e8,0);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_110,"Output",&local_111);
  cv::_InputArray::_InputArray(&local_130,local_80);
  cv::imshow(local_110,&local_130);
  cv::_InputArray::~_InputArray(&local_130);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  cv::waitKey(0);
  cv::destroyAllWindows();
  cv::Mat::~Mat(local_80);
  return;
}

Assistant:

void display_ellipses(const cv::Mat& image_test, IT ellipses_begin, IT ellipses_end)
{
    cv::Mat tmp = image_test.clone();
    while(ellipses_begin != ellipses_end)
    {
        cv::ellipse(tmp, *ellipses_begin, cv::Scalar(0, 255, 0), 3);
        ++ellipses_begin;
    }

    cv::namedWindow("Output", cv::WINDOW_NORMAL);
    cv::imshow("Output", tmp);
    cv::waitKey(0);
    cv::destroyAllWindows();
}